

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.h
# Opt level: O2

void __thiscall GLPortal::GLPortal(GLPortal *this,bool local)

{
  undefined7 in_register_00000031;
  GLPortal *local_20;
  
  this->_vptr_GLPortal = (_func_int **)&PTR__GLPortal_007c3288;
  (this->savedmapsection).Array = (uchar *)0x0;
  (this->savedmapsection).Most = 0;
  (this->savedmapsection).Count = 0;
  (this->mPrimIndices).Array = (uint *)0x0;
  (this->mPrimIndices).Most = 0;
  (this->mPrimIndices).Count = 0;
  (this->lines).Array = (GLWall *)0x0;
  (this->lines).Most = 0;
  (this->lines).Count = 0;
  if ((int)CONCAT71(in_register_00000031,local) == 0) {
    local_20 = this;
    TArray<GLPortal_*,_GLPortal_*>::Push(&portals,&local_20);
  }
  return;
}

Assistant:

GLPortal(bool local = false) { if (!local) portals.Push(this); }